

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O1

int run_test_timer_order(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  uv_loop_t *puVar2;
  uv_loop_t *unaff_RBX;
  uv_loop_t *loop;
  undefined8 *puVar3;
  code **ppcVar4;
  uv_timer_t *puVar5;
  int64_t eval_b;
  int64_t eval_b_1;
  int second;
  int first;
  uv_timer_t handle_b;
  uv_timer_t handle_a;
  uv_timer_t uStack_2b8;
  uv_loop_t *puStack_240;
  code *pcStack_238;
  void *pvStack_230;
  undefined1 auStack_228 [16];
  undefined8 uStack_218;
  uv__queue *puStack_210;
  undefined1 auStack_208 [24];
  uv_close_cb p_Stack_1f0;
  uv_loop_t *puStack_1e8;
  undefined8 uStack_1d8;
  undefined1 auStack_1d0 [8];
  uv_timer_t uStack_1c8;
  uv_loop_t *puStack_150;
  uv__queue *puStack_140;
  uv__queue *puStack_138;
  undefined1 auStack_128 [8];
  code *pcStack_120;
  undefined8 local_118 [2];
  undefined1 local_108 [8];
  uv_timer_t local_100;
  uv_timer_t local_88;
  
  puVar3 = local_118;
  local_108._4_4_ = 0;
  local_108._0_4_ = 1;
  pcStack_120 = (code *)0x1d2d58;
  puVar2 = uv_default_loop();
  pcStack_120 = (code *)0x1d2d68;
  iVar1 = uv_timer_init(puVar2,&local_88);
  local_100.data = (void *)(long)iVar1;
  local_118[0] = 0;
  if ((uv_loop_t *)local_100.data == (uv_loop_t *)0x0) {
    pcStack_120 = (code *)0x1d2d8b;
    puVar2 = uv_default_loop();
    pcStack_120 = (code *)0x1d2d98;
    iVar1 = uv_timer_init(puVar2,&local_100);
    local_118[0] = SEXT48(iVar1);
    local_118[1] = (__pthread_internal_list *)0x0;
    if (local_118[0] != 0) goto LAB_001d3008;
    unaff_RBX = (uv_loop_t *)(local_108 + 4);
    pcStack_120 = (code *)0x1d2dd6;
    local_88.data = unaff_RBX;
    iVar1 = uv_timer_start(&local_88,order_cb_a,0,0);
    local_118[0] = SEXT48(iVar1);
    local_118[1] = (__pthread_internal_list *)0x0;
    if (local_118[0] != 0) goto LAB_001d3015;
    pcStack_120 = (code *)0x1d2e11;
    local_100.data = (uv_loop_t *)local_108;
    iVar1 = uv_timer_start(&local_100,order_cb_b,0,0);
    local_118[0] = SEXT48(iVar1);
    local_118[1] = (__pthread_internal_list *)0x0;
    if (local_118[0] != 0) goto LAB_001d3022;
    pcStack_120 = (code *)0x1d2e34;
    puVar2 = uv_default_loop();
    pcStack_120 = (code *)0x1d2e3e;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    local_118[0] = SEXT48(iVar1);
    local_118[1] = (__pthread_internal_list *)0x0;
    if (local_118[0] != 0) goto LAB_001d302f;
    local_118[0] = 2;
    local_118[1] = SEXT48(order_cb_called);
    if ((__pthread_internal_list *)local_118[1] != (__pthread_internal_list *)0x2)
    goto LAB_001d303c;
    pcStack_120 = (code *)0x1d2e8c;
    iVar1 = uv_timer_stop(&local_88);
    local_118[0] = SEXT48(iVar1);
    local_118[1] = (__pthread_internal_list *)0x0;
    if (local_118[0] != 0) goto LAB_001d3049;
    pcStack_120 = (code *)0x1d2eb4;
    iVar1 = uv_timer_stop(&local_100);
    local_118[0] = SEXT48(iVar1);
    local_118[1] = (__pthread_internal_list *)0x0;
    if (local_118[0] != 0) goto LAB_001d3056;
    order_cb_called = 0;
    pcStack_120 = (code *)0x1d2ef4;
    local_100.data = unaff_RBX;
    iVar1 = uv_timer_start(&local_100,order_cb_b,0,0);
    local_118[0] = SEXT48(iVar1);
    local_118[1] = (__pthread_internal_list *)0x0;
    if (local_118[0] != 0) goto LAB_001d3063;
    pcStack_120 = (code *)0x1d2f2d;
    local_88.data = (uv_loop_t *)local_108;
    iVar1 = uv_timer_start(&local_88,order_cb_a,0,0);
    local_118[0] = SEXT48(iVar1);
    local_118[1] = (__pthread_internal_list *)0x0;
    if (local_118[0] != 0) goto LAB_001d3070;
    pcStack_120 = (code *)0x1d2f50;
    puVar2 = uv_default_loop();
    pcStack_120 = (code *)0x1d2f5a;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    local_118[0] = SEXT48(iVar1);
    local_118[1] = (__pthread_internal_list *)0x0;
    if (local_118[0] != 0) goto LAB_001d307d;
    local_118[0] = 2;
    local_118[1] = SEXT48(order_cb_called);
    if ((__pthread_internal_list *)local_118[1] != (__pthread_internal_list *)0x2)
    goto LAB_001d308a;
    pcStack_120 = (code *)0x1d2fa0;
    unaff_RBX = uv_default_loop();
    pcStack_120 = (code *)0x1d2fb4;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    pcStack_120 = (code *)0x1d2fbe;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    local_118[0] = 0;
    pcStack_120 = (code *)0x1d2fcb;
    puVar2 = uv_default_loop();
    pcStack_120 = (code *)0x1d2fd3;
    iVar1 = uv_loop_close(puVar2);
    local_118[1] = SEXT48(iVar1);
    if (local_118[0] == local_118[1]) {
      pcStack_120 = (code *)0x1d2fee;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_120 = (code *)0x1d3008;
    run_test_timer_order_cold_1();
LAB_001d3008:
    pcStack_120 = (code *)0x1d3015;
    run_test_timer_order_cold_2();
LAB_001d3015:
    pcStack_120 = (code *)0x1d3022;
    run_test_timer_order_cold_3();
LAB_001d3022:
    pcStack_120 = (code *)0x1d302f;
    run_test_timer_order_cold_4();
LAB_001d302f:
    pcStack_120 = (code *)0x1d303c;
    run_test_timer_order_cold_5();
LAB_001d303c:
    pcStack_120 = (code *)0x1d3049;
    run_test_timer_order_cold_6();
LAB_001d3049:
    pcStack_120 = (code *)0x1d3056;
    run_test_timer_order_cold_7();
LAB_001d3056:
    pcStack_120 = (code *)0x1d3063;
    run_test_timer_order_cold_8();
LAB_001d3063:
    pcStack_120 = (code *)0x1d3070;
    run_test_timer_order_cold_9();
LAB_001d3070:
    pcStack_120 = (code *)0x1d307d;
    run_test_timer_order_cold_10();
LAB_001d307d:
    pcStack_120 = (code *)0x1d308a;
    run_test_timer_order_cold_11();
LAB_001d308a:
    pcStack_120 = (code *)0x1d3097;
    run_test_timer_order_cold_12();
  }
  pcStack_120 = order_cb_a;
  run_test_timer_order_cold_13();
  iVar1 = order_cb_called;
  pcStack_120 = (code *)(long)order_cb_called;
  order_cb_called = order_cb_called + 1;
  auStack_128 = (undefined1  [8])(long)*(int *)*puVar3;
  if ((undefined1  [8])pcStack_120 == auStack_128) {
    return iVar1;
  }
  ppcVar4 = &pcStack_120;
  puStack_138 = (uv__queue *)order_cb_b;
  order_cb_a_cold_1();
  iVar1 = order_cb_called;
  puStack_138 = (uv__queue *)(long)order_cb_called;
  order_cb_called = order_cb_called + 1;
  puStack_140 = (uv__queue *)(long)*(int *)*ppcVar4;
  if (puStack_138 == puStack_140) {
    return iVar1;
  }
  puStack_150 = (uv_loop_t *)run_test_timer_zero_timeout;
  order_cb_b_cold_1();
  puStack_1e8 = (uv_loop_t *)0x1d3139;
  puStack_150 = unaff_RBX;
  puVar2 = uv_default_loop();
  puStack_1e8 = (uv_loop_t *)0x1d3149;
  iVar1 = uv_timer_init(puVar2,(uv_timer_t *)(auStack_1d0 + 8));
  auStack_1d0 = (undefined1  [8])(long)iVar1;
  uStack_1d8 = (uv_handle_t *)0x0;
  if (auStack_1d0 == (undefined1  [8])0x0) {
    puStack_1e8 = (uv_loop_t *)0x1d317e;
    iVar1 = uv_timer_start((uv_timer_t *)(auStack_1d0 + 8),zero_timeout_cb,0,0);
    auStack_1d0 = (undefined1  [8])(long)iVar1;
    uStack_1d8 = (uv_handle_t *)0x0;
    if (auStack_1d0 != (undefined1  [8])0x0) goto LAB_001d32a6;
    auStack_1d0 = (undefined1  [8])0x1;
    puStack_1e8 = (uv_loop_t *)0x1d31b1;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    uStack_1d8 = SEXT48(iVar1);
    if (auStack_1d0 != (undefined1  [8])uStack_1d8) goto LAB_001d32b5;
    auStack_1d0 = (undefined1  [8])0x1;
    uStack_1d8 = SEXT48(zero_timeout_cb_calls);
    if ((uv_handle_t *)uStack_1d8 != (uv_handle_t *)0x1) goto LAB_001d32c4;
    puStack_1e8 = (uv_loop_t *)0x1d31f9;
    uv_close((uv_handle_t *)(auStack_1d0 + 8),(uv_close_cb)0x0);
    puStack_1e8 = (uv_loop_t *)0x1d3203;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_1d0 = (undefined1  [8])(long)iVar1;
    uStack_1d8 = (uv_handle_t *)0x0;
    if (auStack_1d0 != (undefined1  [8])0x0) goto LAB_001d32d3;
    auStack_1d0 = (undefined1  [8])0x1;
    uStack_1d8 = SEXT48(zero_timeout_cb_calls);
    if ((uv_handle_t *)uStack_1d8 != (uv_handle_t *)0x1) goto LAB_001d32e2;
    puStack_1e8 = (uv_loop_t *)0x1d3259;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    puStack_1e8 = (uv_loop_t *)0x1d3263;
    uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_1d0 = (undefined1  [8])0x0;
    puStack_1e8 = (uv_loop_t *)0x1d3274;
    iVar1 = uv_loop_close(puVar2);
    uStack_1d8 = SEXT48(iVar1);
    if (auStack_1d0 == (undefined1  [8])uStack_1d8) {
      puStack_1e8 = (uv_loop_t *)0x1d328c;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_1e8 = (uv_loop_t *)0x1d32a6;
    run_test_timer_zero_timeout_cold_1();
LAB_001d32a6:
    puStack_1e8 = (uv_loop_t *)0x1d32b5;
    run_test_timer_zero_timeout_cold_2();
LAB_001d32b5:
    puStack_1e8 = (uv_loop_t *)0x1d32c4;
    run_test_timer_zero_timeout_cold_3();
LAB_001d32c4:
    puStack_1e8 = (uv_loop_t *)0x1d32d3;
    run_test_timer_zero_timeout_cold_4();
LAB_001d32d3:
    puStack_1e8 = (uv_loop_t *)0x1d32e2;
    run_test_timer_zero_timeout_cold_5();
LAB_001d32e2:
    puStack_1e8 = (uv_loop_t *)0x1d32f1;
    run_test_timer_zero_timeout_cold_6();
  }
  loop = (uv_loop_t *)auStack_1d0;
  puStack_1e8 = (uv_loop_t *)zero_timeout_cb;
  run_test_timer_zero_timeout_cold_7();
  auStack_208._8_8_ = (uv_loop_t *)0x1d3318;
  puStack_1e8 = puVar2;
  iVar1 = uv_timer_start((uv_timer_t *)loop,zero_timeout_cb,0,0);
  p_Stack_1f0 = (uv_close_cb)(long)iVar1;
  auStack_208._16_8_ = (uv_handle_t *)0x0;
  if (p_Stack_1f0 == (uv_close_cb)0x0) {
    auStack_208._8_8_ = (uv_loop_t *)0x1d333b;
    uv_stop(*(uv_loop_t **)&loop->active_handles);
    zero_timeout_cb_calls = zero_timeout_cb_calls + 1;
    return extraout_EAX;
  }
  auStack_208._8_8_ = run_test_timer_huge_timeout;
  zero_timeout_cb_cold_1();
  uStack_218._0_4_ = 0x1d335e;
  uStack_218._4_4_ = 0;
  auStack_208._8_8_ = loop;
  puVar2 = uv_default_loop();
  uStack_218._0_4_ = 0x1d336d;
  uStack_218._4_4_ = 0;
  iVar1 = uv_timer_init(puVar2,&tiny_timer);
  auStack_208._0_8_ = SEXT48(iVar1);
  puStack_210 = (uv__queue *)0x0;
  if ((uv__queue *)auStack_208._0_8_ == (uv__queue *)0x0) {
    uStack_218._0_4_ = 0x1d3390;
    uStack_218._4_4_ = 0;
    puVar2 = uv_default_loop();
    uStack_218._0_4_ = 0x1d339f;
    uStack_218._4_4_ = 0;
    iVar1 = uv_timer_init(puVar2,&huge_timer1);
    auStack_208._0_8_ = SEXT48(iVar1);
    puStack_210 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_208._0_8_ != (uv__queue *)0x0) goto LAB_001d35aa;
    uStack_218._0_4_ = 0x1d33c2;
    uStack_218._4_4_ = 0;
    puVar2 = uv_default_loop();
    uStack_218._0_4_ = 0x1d33d1;
    uStack_218._4_4_ = 0;
    iVar1 = uv_timer_init(puVar2,&huge_timer2);
    auStack_208._0_8_ = SEXT48(iVar1);
    puStack_210 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_208._0_8_ != (uv__queue *)0x0) goto LAB_001d35b7;
    uStack_218._0_4_ = 0x1d3409;
    uStack_218._4_4_ = 0;
    iVar1 = uv_timer_start(&tiny_timer,tiny_timer_cb,1,0);
    auStack_208._0_8_ = SEXT48(iVar1);
    puStack_210 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_208._0_8_ != (uv__queue *)0x0) goto LAB_001d35c4;
    loop = (uv_loop_t *)0xffffffffffff;
    uStack_218._0_4_ = 0x1d3449;
    uStack_218._4_4_ = 0;
    iVar1 = uv_timer_start(&huge_timer1,tiny_timer_cb,0xffffffffffff,0);
    auStack_208._0_8_ = SEXT48(iVar1);
    puStack_210 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_208._0_8_ != (uv__queue *)0x0) goto LAB_001d35d1;
    uStack_218._0_4_ = 0x1d3483;
    uStack_218._4_4_ = 0;
    iVar1 = uv_timer_start(&huge_timer2,tiny_timer_cb,0xffffffffffffffff,0);
    auStack_208._0_8_ = SEXT48(iVar1);
    puStack_210 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_208._0_8_ != (uv__queue *)0x0) goto LAB_001d35de;
    auStack_208._0_8_ = (uv__queue *)0x1;
    uStack_218._0_4_ = 0x1d34b6;
    uStack_218._4_4_ = 0;
    puStack_210 = (uv__queue *)uv_timer_get_due_in(&tiny_timer);
    if ((uv__queue *)auStack_208._0_8_ != puStack_210) goto LAB_001d35eb;
    auStack_208._0_8_ = (uv__queue *)0xffffffffffff;
    uStack_218._0_4_ = 0x1d34da;
    uStack_218._4_4_ = 0;
    puStack_210 = (uv__queue *)uv_timer_get_due_in(&huge_timer1);
    if ((uv__queue *)auStack_208._0_8_ != puStack_210) goto LAB_001d35f8;
    auStack_208._0_8_ = (uv__queue *)0x0;
    uStack_218._0_4_ = 0x1d3502;
    uStack_218._4_4_ = 0;
    puStack_210 = (uv__queue *)uv_timer_get_due_in(&huge_timer2);
    if (puStack_210 < (ulong)auStack_208._0_8_) goto LAB_001d3605;
    uStack_218._0_4_ = 0x1d351a;
    uStack_218._4_4_ = 0;
    puVar2 = uv_default_loop();
    uStack_218._0_4_ = 0x1d3524;
    uStack_218._4_4_ = 0;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_208._0_8_ = SEXT48(iVar1);
    puStack_210 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_208._0_8_ != (uv__queue *)0x0) goto LAB_001d3612;
    uStack_218._0_4_ = 0x1d3547;
    uStack_218._4_4_ = 0;
    loop = uv_default_loop();
    uStack_218._0_4_ = 0x1d355b;
    uStack_218._4_4_ = 0;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    uStack_218._0_4_ = 0x1d3565;
    uStack_218._4_4_ = 0;
    uv_run(loop,UV_RUN_DEFAULT);
    auStack_208._0_8_ = (uv__queue *)0x0;
    uStack_218._0_4_ = 0x1d3573;
    uStack_218._4_4_ = 0;
    puVar2 = uv_default_loop();
    uStack_218._0_4_ = 0x1d357b;
    uStack_218._4_4_ = 0;
    iVar1 = uv_loop_close(puVar2);
    puStack_210 = (uv__queue *)(long)iVar1;
    if ((uv__queue *)auStack_208._0_8_ == puStack_210) {
      uStack_218._0_4_ = 0x1d3595;
      uStack_218._4_4_ = 0;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    uStack_218._0_4_ = 0x1d35aa;
    uStack_218._4_4_ = 0;
    run_test_timer_huge_timeout_cold_1();
LAB_001d35aa:
    uStack_218._0_4_ = 0x1d35b7;
    uStack_218._4_4_ = 0;
    run_test_timer_huge_timeout_cold_2();
LAB_001d35b7:
    uStack_218._0_4_ = 0x1d35c4;
    uStack_218._4_4_ = 0;
    run_test_timer_huge_timeout_cold_3();
LAB_001d35c4:
    uStack_218._0_4_ = 0x1d35d1;
    uStack_218._4_4_ = 0;
    run_test_timer_huge_timeout_cold_4();
LAB_001d35d1:
    uStack_218._0_4_ = 0x1d35de;
    uStack_218._4_4_ = 0;
    run_test_timer_huge_timeout_cold_5();
LAB_001d35de:
    uStack_218._0_4_ = 0x1d35eb;
    uStack_218._4_4_ = 0;
    run_test_timer_huge_timeout_cold_6();
LAB_001d35eb:
    uStack_218._0_4_ = 0x1d35f8;
    uStack_218._4_4_ = 0;
    run_test_timer_huge_timeout_cold_7();
LAB_001d35f8:
    uStack_218._0_4_ = 0x1d3605;
    uStack_218._4_4_ = 0;
    run_test_timer_huge_timeout_cold_8();
LAB_001d3605:
    uStack_218._0_4_ = 0x1d3612;
    uStack_218._4_4_ = 0;
    run_test_timer_huge_timeout_cold_11();
LAB_001d3612:
    uStack_218._0_4_ = 0x1d361f;
    uStack_218._4_4_ = 0;
    run_test_timer_huge_timeout_cold_9();
  }
  puVar5 = (uv_timer_t *)auStack_208;
  uStack_218 = tiny_timer_cb;
  run_test_timer_huge_timeout_cold_10();
  if (puVar5 == &tiny_timer) {
    auStack_228._8_8_ = (uv_loop_t *)0x1d3647;
    uv_close((uv_handle_t *)&tiny_timer,(uv_close_cb)0x0);
    auStack_228._8_8_ = (uv_loop_t *)0x1d3655;
    uv_close((uv_handle_t *)&huge_timer1,(uv_close_cb)0x0);
    uv_close((uv_handle_t *)&huge_timer2,(uv_close_cb)0x0);
    return extraout_EAX_00;
  }
  auStack_228._8_8_ = run_test_timer_huge_repeat;
  tiny_timer_cb_cold_1();
  pcStack_238 = (code *)0x1d3673;
  auStack_228._8_8_ = loop;
  puVar2 = uv_default_loop();
  pcStack_238 = (code *)0x1d3682;
  iVar1 = uv_timer_init(puVar2,&tiny_timer);
  auStack_228._0_8_ = SEXT48(iVar1);
  pvStack_230 = (void *)0x0;
  if ((void *)auStack_228._0_8_ == (void *)0x0) {
    pcStack_238 = (code *)0x1d36a5;
    puVar2 = uv_default_loop();
    pcStack_238 = (code *)0x1d36b4;
    iVar1 = uv_timer_init(puVar2,&huge_timer1);
    auStack_228._0_8_ = SEXT48(iVar1);
    pvStack_230 = (void *)0x0;
    if ((void *)auStack_228._0_8_ != (void *)0x0) goto LAB_001d37db;
    pcStack_238 = (code *)0x1d36ef;
    iVar1 = uv_timer_start(&tiny_timer,huge_repeat_cb,2,2);
    auStack_228._0_8_ = SEXT48(iVar1);
    pvStack_230 = (void *)0x0;
    if ((void *)auStack_228._0_8_ != (void *)0x0) goto LAB_001d37e8;
    pcStack_238 = (code *)0x1d372c;
    iVar1 = uv_timer_start(&huge_timer1,huge_repeat_cb,1,0xffffffffffffffff);
    auStack_228._0_8_ = SEXT48(iVar1);
    pvStack_230 = (void *)0x0;
    if ((void *)auStack_228._0_8_ != (void *)0x0) goto LAB_001d37f5;
    pcStack_238 = (code *)0x1d374f;
    puVar2 = uv_default_loop();
    pcStack_238 = (code *)0x1d3759;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_228._0_8_ = SEXT48(iVar1);
    pvStack_230 = (void *)0x0;
    if ((void *)auStack_228._0_8_ != (void *)0x0) goto LAB_001d3802;
    pcStack_238 = (code *)0x1d377c;
    loop = uv_default_loop();
    pcStack_238 = (code *)0x1d3790;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    pcStack_238 = (code *)0x1d379a;
    uv_run(loop,UV_RUN_DEFAULT);
    auStack_228._0_8_ = (void *)0x0;
    pcStack_238 = (code *)0x1d37a8;
    puVar2 = uv_default_loop();
    pcStack_238 = (code *)0x1d37b0;
    iVar1 = uv_loop_close(puVar2);
    pvStack_230 = (void *)(long)iVar1;
    if ((void *)auStack_228._0_8_ == pvStack_230) {
      pcStack_238 = (code *)0x1d37c6;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_238 = (code *)0x1d37db;
    run_test_timer_huge_repeat_cold_1();
LAB_001d37db:
    pcStack_238 = (code *)0x1d37e8;
    run_test_timer_huge_repeat_cold_2();
LAB_001d37e8:
    pcStack_238 = (code *)0x1d37f5;
    run_test_timer_huge_repeat_cold_3();
LAB_001d37f5:
    pcStack_238 = (code *)0x1d3802;
    run_test_timer_huge_repeat_cold_4();
LAB_001d3802:
    pcStack_238 = (code *)0x1d380f;
    run_test_timer_huge_repeat_cold_5();
  }
  puVar5 = (uv_timer_t *)auStack_228;
  pcStack_238 = huge_repeat_cb;
  run_test_timer_huge_repeat_cold_6();
  iVar1 = huge_repeat_cb::ncalls;
  pcStack_238._0_4_ = extraout_EAX_01;
  if (huge_repeat_cb::ncalls != 0) {
    if (puVar5 == &tiny_timer) goto LAB_001d3844;
    puStack_240 = (uv_loop_t *)0x1d3838;
    huge_repeat_cb_cold_1();
    iVar1 = extraout_EAX_02;
  }
  if (puVar5 == &huge_timer1) {
LAB_001d3844:
    huge_repeat_cb::ncalls = iVar1 + 1;
    if (huge_repeat_cb::ncalls == 10) {
      puStack_240 = (uv_loop_t *)0x1d385f;
      uv_close((uv_handle_t *)&tiny_timer,(uv_close_cb)0x0);
      uv_close((uv_handle_t *)&huge_timer1,(uv_close_cb)0x0);
      return extraout_EAX_03;
    }
    return (int)pcStack_238;
  }
  puStack_240 = (uv_loop_t *)run_test_timer_run_once;
  huge_repeat_cb_cold_2();
  puStack_240 = loop;
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&uStack_2b8);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(&uStack_2b8,timer_run_once_timer_cb,0,0);
    if (iVar1 != 0) goto LAB_001d3a75;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    if (iVar1 != 0) goto LAB_001d3a84;
    if (timer_run_once_timer_cb_called != 1) goto LAB_001d3a93;
    iVar1 = uv_timer_start(&uStack_2b8,timer_run_once_timer_cb,1,0);
    if (iVar1 != 0) goto LAB_001d3aa2;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    if (iVar1 != 0) goto LAB_001d3ab1;
    if (timer_run_once_timer_cb_called != 2) goto LAB_001d3ac0;
    uv_close((uv_handle_t *)&uStack_2b8,(uv_close_cb)0x0);
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d3ade;
    }
  }
  else {
    run_test_timer_run_once_cold_1();
LAB_001d3a75:
    run_test_timer_run_once_cold_2();
LAB_001d3a84:
    run_test_timer_run_once_cold_3();
LAB_001d3a93:
    run_test_timer_run_once_cold_4();
LAB_001d3aa2:
    run_test_timer_run_once_cold_5();
LAB_001d3ab1:
    run_test_timer_run_once_cold_6();
LAB_001d3ac0:
    run_test_timer_run_once_cold_7();
  }
  run_test_timer_run_once_cold_8();
LAB_001d3ade:
  run_test_timer_run_once_cold_9();
  timer_run_once_timer_cb_called = timer_run_once_timer_cb_called + 1;
  return extraout_EAX_04;
}

Assistant:

TEST_IMPL(timer_order) {
  int first;
  int second;
  uv_timer_t handle_a;
  uv_timer_t handle_b;

  first = 0;
  second = 1;
  ASSERT_OK(uv_timer_init(uv_default_loop(), &handle_a));
  ASSERT_OK(uv_timer_init(uv_default_loop(), &handle_b));

  /* Test for starting handle_a then handle_b */
  handle_a.data = &first;
  ASSERT_OK(uv_timer_start(&handle_a, order_cb_a, 0, 0));
  handle_b.data = &second;
  ASSERT_OK(uv_timer_start(&handle_b, order_cb_b, 0, 0));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_EQ(2, order_cb_called);

  ASSERT_OK(uv_timer_stop(&handle_a));
  ASSERT_OK(uv_timer_stop(&handle_b));

  /* Test for starting handle_b then handle_a */
  order_cb_called = 0;
  handle_b.data = &first;
  ASSERT_OK(uv_timer_start(&handle_b, order_cb_b, 0, 0));

  handle_a.data = &second;
  ASSERT_OK(uv_timer_start(&handle_a, order_cb_a, 0, 0));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_EQ(2, order_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}